

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  xmlChar xVar1;
  xmlParserInputState xVar2;
  xmlEntityType xVar3;
  xmlGenericErrorFunc p_Var4;
  getParameterEntitySAXFunc p_Var5;
  xmlParserInputPtr pxVar6;
  getEntitySAXFunc p_Var7;
  uint uVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  xmlChar *pxVar13;
  int *piVar14;
  xmlGenericErrorFunc *pp_Var15;
  void **ppvVar16;
  xmlEntityPtr pxVar17;
  xmlBufferPtr buf;
  xmlParserInputPtr input;
  xmlChar *pxVar18;
  xmlChar *pxVar19;
  char cVar20;
  char *msg;
  ulong uVar21;
  xmlParserErrors xVar22;
  size_t sVar23;
  size_t sVar24;
  xmlChar *pxVar25;
  ulong uVar26;
  undefined7 in_register_00000081;
  byte *pbVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  int l;
  byte *local_70;
  size_t local_68;
  ulong local_60;
  xmlChar *local_58;
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  byte *local_38;
  
  pxVar25 = (xmlChar *)CONCAT71(in_register_00000081,end);
  if (-1 < len && (str != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) {
    local_4c = what;
    if ((0x28 < ctxt->depth) && ((0x400 < ctxt->depth || ((ctxt->options & 0x80000U) == 0)))) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      return (xmlChar *)0x0;
    }
    pxVar13 = (xmlChar *)(*xmlMallocAtomic)(300);
    uVar11 = 0;
    if (pxVar13 != (xmlChar *)0x0) {
      if (len != 0) {
        uVar11 = xmlStringCurrentChar(ctxt,str,&local_48);
      }
      sVar23 = 0;
      local_3c = (uint)end3;
      if ((((uVar11 != local_3c) && (local_40 = (uint)end2, uVar11 != local_40)) && (uVar11 != 0))
         && (local_44 = (uint)end, uVar11 != local_44)) {
        local_38 = str + (uint)len;
        uVar26 = 300;
        sVar23 = 0;
        while (ctxt->instate != XML_PARSER_EOF) {
          if (uVar11 == 0x26) {
            if (str[1] == 0x23) {
              uVar11 = 0;
              if (str != (byte *)0x0) {
                if (*str == 0x26) {
                  bVar10 = str[2];
                  if (bVar10 == 0x78) {
                    bVar10 = str[3];
                    pbVar27 = str + 3;
                    bVar29 = bVar10 == 0x3b;
                    if (bVar29) {
                      uVar11 = 0;
                    }
                    else {
                      uVar11 = 0;
                      do {
                        uVar8 = (uint)bVar10;
                        if ((byte)(bVar10 - 0x30) < 10) {
                          uVar11 = (uVar11 * 0x10 + uVar8) - 0x30;
                        }
                        else if ((byte)(bVar10 + 0x9f) < 6) {
                          uVar11 = (uVar11 * 0x10 + uVar8) - 0x57;
                        }
                        else {
                          if (5 < (byte)(bVar10 + 0xbf)) {
                            xVar22 = XML_ERR_INVALID_HEX_CHARREF;
                            goto LAB_0015ae04;
                          }
                          uVar11 = (uVar11 * 0x10 + uVar8) - 0x37;
                        }
                        if (0x10ffff < (int)uVar11) {
                          uVar11 = 0x110000;
                        }
                        bVar10 = pbVar27[1];
                        pbVar27 = pbVar27 + 1;
                        bVar29 = bVar10 == 0x3b;
                      } while (!bVar29);
                    }
                  }
                  else {
                    pbVar27 = str + 2;
                    bVar29 = bVar10 == 0x3b;
                    if (bVar29) {
                      uVar11 = 0;
                    }
                    else {
                      xVar22 = XML_ERR_INVALID_DEC_CHARREF;
                      if ((byte)(bVar10 - 0x30) < 10) {
                        uVar11 = 0;
                        pbVar9 = str + 3;
                        do {
                          pbVar27 = pbVar9;
                          uVar11 = ((uint)bVar10 + uVar11 * 10) - 0x30;
                          if (0x10ffff < (int)uVar11) {
                            uVar11 = 0x110000;
                          }
                          bVar10 = *pbVar27;
                          bVar29 = bVar10 == 0x3b;
                          local_68 = sVar23;
                          if (bVar29) goto LAB_0015ae1a;
                          pbVar9 = pbVar27 + 1;
                        } while ((byte)(bVar10 - 0x30) < 10);
                      }
LAB_0015ae04:
                      uVar11 = 0;
                      local_68 = sVar23;
                      xmlFatalErr(ctxt,xVar22,(char *)0x0);
                      sVar23 = local_68;
                    }
                  }
LAB_0015ae1a:
                  str = pbVar27 + bVar29;
                  if ((int)uVar11 < 0x110000) {
                    if ((int)uVar11 < 0x100) {
                      if (((int)uVar11 < 0x20) &&
                         ((0xd < uVar11 || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0)))) {
LAB_0015af8f:
                        xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                          "xmlParseStringCharRef: invalid xmlChar value %d\n",uVar11
                                         );
                        goto LAB_0015a6ef;
                      }
                    }
                    else if (0xffffd7ff < uVar11 - 0x10000 && 0x1ffd < uVar11 - 0xe000)
                    goto LAB_0015af8f;
                  }
                  else {
                    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                      "xmlParseStringCharRef: character reference out of bounds\n",
                                      uVar11);
                    uVar11 = 0;
                  }
                }
                else {
                  xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
LAB_0015a6ef:
                  uVar11 = 0;
                }
              }
              if (uVar11 == 0) {
                cVar20 = '\x05';
                sVar24 = sVar23;
              }
              else {
                iVar12 = xmlCopyCharMultiByte(pxVar13 + sVar23,uVar11);
                sVar24 = sVar23 + (long)iVar12;
                cVar20 = '\0';
                if (uVar26 < (long)iVar12 + sVar23 + 100) {
                  uVar21 = uVar26 * 2 + 100;
                  cVar20 = '\x02';
                  if (uVar26 <= uVar21) {
                    pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                    if (pxVar19 != (xmlChar *)0x0) {
                      pxVar13 = pxVar19;
                      uVar26 = uVar21;
                    }
                    cVar20 = (pxVar19 == (xmlChar *)0x0) * '\x02';
                  }
                }
              }
              sVar23 = sVar24;
              if (cVar20 == '\0') goto LAB_0015af13;
              if (cVar20 != '\x02') {
                pxVar19 = (xmlChar *)0x0;
                if (cVar20 != '\x05') {
                  return pxVar13;
                }
                goto LAB_0015b402;
              }
LAB_0015b48b:
              local_58 = (xmlChar *)0x0;
              goto LAB_0015b3f3;
            }
            if ((local_4c & 1) == 0) goto LAB_0015a419;
            local_68 = sVar23;
            local_60 = uVar26;
            piVar14 = __xmlParserDebugEntities();
            if (*piVar14 != 0) {
              pp_Var15 = __xmlGenericError();
              p_Var4 = *pp_Var15;
              ppvVar16 = __xmlGenericErrorContext();
              (*p_Var4)(*ppvVar16,"String decoding Entity Reference: %.30s\n",str);
            }
            if ((str == (byte *)0x0) || (local_70 = str, *str != 0x26)) {
LAB_0015a604:
              pxVar17 = (xmlEntityPtr)0x0;
            }
            else {
              local_70 = str + 1;
              pxVar19 = xmlParseStringName(ctxt,&local_70);
              pbVar27 = local_70;
              if (pxVar19 == (xmlChar *)0x0) {
                xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringEntityRef: no name\n");
                str = local_70;
                goto LAB_0015a604;
              }
              if (*local_70 != 0x3b) {
                xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
                (*xmlFree)(pxVar19);
                str = pbVar27;
                goto LAB_0015a604;
              }
              pbVar27 = local_70 + 1;
              local_70 = pbVar27;
              if (((ctxt->options & 0x100000) == 0) &&
                 (pxVar17 = xmlGetPredefinedEntity(pxVar19), pxVar17 != (xmlEntityPtr)0x0)) {
LAB_0015b3b7:
                (*xmlFree)(pxVar19);
                str = pbVar27;
              }
              else {
                ctxt->nbentities = ctxt->nbentities + 1;
                if (ctxt->sax == (_xmlSAXHandler *)0x0) {
LAB_0015b279:
                  pxVar17 = (xmlEntityPtr)0x0;
                }
                else {
                  p_Var7 = ctxt->sax->getEntity;
                  if (p_Var7 == (getEntitySAXFunc)0x0) {
                    pxVar17 = (xmlEntityPtr)0x0;
                  }
                  else {
                    pxVar17 = (*p_Var7)(ctxt->userData,pxVar19);
                  }
                  if (pxVar17 == (xmlEntityPtr)0x0) {
                    if ((ctxt->options & 0x100000) == 0) {
                      pxVar17 = (xmlEntityPtr)0x0;
                    }
                    else {
                      pxVar17 = xmlGetPredefinedEntity(pxVar19);
                    }
                  }
                  if (pxVar17 == (xmlEntityPtr)0x0) {
                    if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_0015b279;
                    pxVar17 = xmlSAX2GetEntity(ctxt,pxVar19);
                  }
                }
                xVar2 = ctxt->instate;
                if (xVar2 != XML_PARSER_EOF) {
                  if (pxVar17 == (xmlEntityPtr)0x0) {
                    if ((ctxt->standalone == 1) ||
                       ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                      xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n"
                                        ,pxVar19);
                    }
                    else {
                      xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",
                                   pxVar19);
                    }
                    xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                  }
                  else {
                    xVar3 = pxVar17->etype;
                    if (xVar3 == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
                      xVar22 = XML_ERR_UNPARSED_ENTITY;
                      msg = "Entity reference to unparsed entity %s\n";
                    }
                    else if ((xVar2 == XML_PARSER_ATTRIBUTE_VALUE) &&
                            (xVar3 == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
                      xVar22 = XML_ERR_ENTITY_IS_EXTERNAL;
                      msg = "Attribute references external entity \'%s\'\n";
                    }
                    else if ((xVar2 == XML_PARSER_ATTRIBUTE_VALUE) &&
                            ((xVar3 != XML_INTERNAL_PREDEFINED_ENTITY &&
                              pxVar17->content != (xmlChar *)0x0 &&
                             (pxVar18 = xmlStrchr(pxVar17->content,'<'), pxVar18 != (xmlChar *)0x0))
                            )) {
                      xVar22 = XML_ERR_LT_IN_ATTRIBUTE;
                      msg = "\'<\' in entity \'%s\' is not allowed in attributes values\n";
                    }
                    else {
                      if ((pxVar17->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                          XML_INTERNAL_PARAMETER_ENTITY) goto LAB_0015b3b7;
                      xVar22 = XML_ERR_ENTITY_IS_PARAMETER;
                      msg = "Attempt to reference the parameter entity \'%s\'\n";
                    }
                    xmlFatalErrMsgStr(ctxt,xVar22,msg,pxVar19);
                  }
                  goto LAB_0015b3b7;
                }
                (*xmlFree)(pxVar19);
                pxVar17 = (xmlEntityPtr)0x0;
              }
            }
            xmlParserEntityCheck(ctxt,0,pxVar17,0);
            sVar24 = local_68;
            sVar23 = local_68;
            uVar26 = local_60;
            if (pxVar17 == (xmlEntityPtr)0x0) goto LAB_0015af13;
            ctxt->nbentities = ctxt->nbentities + (long)(pxVar17->checked / 2);
            pbVar27 = pxVar17->content;
            if (pxVar17->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
              if (pbVar27 != (byte *)0x0) {
                iVar12 = xmlCopyCharMultiByte(pxVar13 + local_68,(uint)*pbVar27);
                sVar23 = sVar24 + (long)iVar12;
                uVar26 = local_60;
                if (local_60 < (long)iVar12 + sVar24 + 100) {
                  uVar21 = local_60 * 2 + 100;
                  if (uVar21 < local_60) {
                    bVar29 = false;
                  }
                  else {
                    pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                    bVar29 = pxVar19 != (xmlChar *)0x0;
                    uVar26 = local_60;
                    if (bVar29) {
                      pxVar13 = pxVar19;
                      uVar26 = uVar21;
                    }
                  }
                  goto joined_r0x0015a6cc;
                }
                goto LAB_0015af13;
              }
              xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,"predefined entity has no content\n");
              goto LAB_0015b47f;
            }
            if (pbVar27 == (byte *)0x0) {
              iVar12 = xmlStrlen(pxVar17->name);
              pxVar19 = pxVar17->name;
              sVar23 = local_68 + 1;
              pxVar13[local_68] = '&';
              uVar26 = local_60;
              if (local_60 < local_68 + (long)iVar12 + 0x65) {
                uVar21 = (long)iVar12 + local_60 * 2 + 100;
                if (uVar21 < local_60) {
                  bVar29 = true;
                  bVar30 = false;
                }
                else {
                  pxVar18 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                  bVar29 = pxVar18 == (xmlChar *)0x0;
                  uVar26 = local_60;
                  if (!bVar29) {
                    uVar26 = uVar21;
                  }
                  bVar30 = !bVar29;
                  if (!bVar29) {
                    pxVar13 = pxVar18;
                  }
                }
                if (bVar30) goto LAB_0015b19a;
              }
              else {
LAB_0015b19a:
                if (0 < iVar12) {
                  iVar12 = iVar12 + 1;
                  do {
                    xVar1 = *pxVar19;
                    pxVar19 = pxVar19 + 1;
                    pxVar13[sVar23] = xVar1;
                    sVar23 = sVar23 + 1;
                    iVar12 = iVar12 + -1;
                  } while (1 < iVar12);
                }
                pxVar13[sVar23] = ';';
                sVar23 = sVar23 + 1;
                bVar29 = false;
              }
              if (bVar29) {
                if (!bVar29) {
                  return pxVar13;
                }
                goto LAB_0015b48b;
              }
              goto LAB_0015af13;
            }
            ctxt->depth = ctxt->depth + 1;
            pxVar25 = (xmlChar *)0x0;
            pxVar18 = xmlStringDecodeEntities(ctxt,pbVar27,local_4c,'\0','\0','\0');
            ctxt->depth = ctxt->depth + -1;
            if (pxVar18 == (xmlChar *)0x0) goto LAB_0015b47f;
            xVar1 = *pxVar18;
            pxVar19 = pxVar18;
            sVar23 = local_68;
            uVar26 = local_60;
            while (xVar1 != '\0') {
              pxVar18 = pxVar18 + 1;
              pxVar13[sVar23] = xVar1;
              local_58 = pxVar19;
              if (uVar26 < sVar23 + 0x65) {
                iVar12 = xmlParserEntityCheck(ctxt,sVar23 + 1,pxVar17,0);
                pxVar19 = local_58;
                if (iVar12 != 0) goto LAB_0015b402;
                uVar21 = uVar26 * 2 + 100;
                if (uVar21 < uVar26) {
                  bVar29 = false;
                }
                else {
                  pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                  bVar29 = pxVar19 != (xmlChar *)0x0;
                  if (bVar29) {
                    uVar26 = uVar21;
                    pxVar13 = pxVar19;
                  }
                }
                if (!bVar29) goto LAB_0015b3f3;
              }
              pxVar19 = local_58;
              sVar23 = sVar23 + 1;
              xVar1 = *pxVar18;
            }
LAB_0015acd8:
            local_60 = uVar26;
            local_68 = sVar23;
            (*xmlFree)(pxVar19);
            sVar23 = local_68;
            uVar26 = local_60;
          }
          else {
LAB_0015a419:
            if (((local_4c & 2) == 0) || (uVar11 != 0x25)) {
              if (local_48 == 1) {
                pxVar13[sVar23] = (xmlChar)uVar11;
                sVar23 = sVar23 + 1;
              }
              else {
                iVar12 = xmlCopyCharMultiByte(pxVar13 + sVar23,uVar11);
                sVar23 = sVar23 + (long)iVar12;
              }
              str = str + local_48;
              if (uVar26 < sVar23 + 100) {
                uVar21 = uVar26 * 2 + 100;
                if (uVar21 < uVar26) {
                  bVar29 = false;
                }
                else {
                  pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                  bVar29 = pxVar19 != (xmlChar *)0x0;
                  if (bVar29) {
                    pxVar13 = pxVar19;
                    uVar26 = uVar21;
                  }
                }
joined_r0x0015a6cc:
                if (!bVar29) goto LAB_0015b48b;
              }
              goto LAB_0015af13;
            }
            local_68 = sVar23;
            local_60 = uVar26;
            piVar14 = __xmlParserDebugEntities();
            if (*piVar14 != 0) {
              pp_Var15 = __xmlGenericError();
              p_Var4 = *pp_Var15;
              ppvVar16 = __xmlGenericErrorContext();
              (*p_Var4)(*ppvVar16,"String decoding PE Reference: %.30s\n",str);
            }
            if ((str == (byte *)0x0) || (local_70 = str, *str != 0x25)) {
LAB_0015a84f:
              pxVar17 = (xmlEntityPtr)0x0;
            }
            else {
              local_70 = str + 1;
              pxVar19 = xmlParseStringName(ctxt,&local_70);
              str = local_70;
              if (pxVar19 == (xmlChar *)0x0) {
                xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringPEReference: no name\n");
                str = local_70;
                goto LAB_0015a84f;
              }
              if (*local_70 != 0x3b) {
                xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
                (*xmlFree)(pxVar19);
                goto LAB_0015a84f;
              }
              str = local_70 + 1;
              ctxt->nbentities = ctxt->nbentities + 1;
              local_70 = str;
              if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                 (p_Var5 = ctxt->sax->getParameterEntity, p_Var5 == (getParameterEntitySAXFunc)0x0))
              {
                pxVar17 = (xmlEntityPtr)0x0;
              }
              else {
                pxVar17 = (*p_Var5)(ctxt->userData,pxVar19);
              }
              if (ctxt->instate == XML_PARSER_EOF) {
                (*xmlFree)(pxVar19);
                pxVar17 = (xmlEntityPtr)0x0;
              }
              else {
                if (pxVar17 == (xmlEntityPtr)0x0) {
                  if ((ctxt->standalone == 1) ||
                     ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                    xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,
                                      "PEReference: %%%s; not found\n",pxVar19);
                  }
                  else {
                    xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",
                                  pxVar19,pxVar25);
                    ctxt->valid = 0;
                  }
                  xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                }
                else if ((pxVar17->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                         XML_INTERNAL_PARAMETER_ENTITY) {
                  xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"%%%s; is not a parameter entity\n",
                                pxVar19,pxVar25);
                }
                ctxt->hasPErefs = 1;
                (*xmlFree)(pxVar19);
              }
            }
            xmlParserEntityCheck(ctxt,0,pxVar17,0);
            sVar23 = local_68;
            uVar26 = local_60;
            if (pxVar17 != (xmlEntityPtr)0x0) {
              ctxt->nbentities = ctxt->nbentities + (long)(pxVar17->checked / 2);
              if (pxVar17->content == (xmlChar *)0x0) {
                if (((ctxt->options & 0x12) == 0) && (ctxt->validate == 0)) {
                  xmlWarningMsg(ctxt,XML_ERR_ENTITY_PROCESSING,
                                "not validating will not read content for PE entity %s\n",
                                pxVar17->name,pxVar25);
                }
                else if ((pxVar17->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                        (pxVar17->etype == XML_EXTERNAL_PARAMETER_ENTITY)) {
                  piVar14 = __xmlParserDebugEntities();
                  if (*piVar14 != 0) {
                    pp_Var15 = __xmlGenericError();
                    p_Var4 = *pp_Var15;
                    ppvVar16 = __xmlGenericErrorContext();
                    (*p_Var4)(*ppvVar16,"Reading %s entity content input\n",pxVar17->name);
                  }
                  buf = xmlBufferCreate();
                  if (buf == (xmlBufferPtr)0x0) {
                    xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
                  }
                  else {
                    input = xmlNewEntityInputStream(ctxt,pxVar17);
                    if (input == (xmlParserInputPtr)0x0) {
                      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent input error");
                    }
                    else {
                      iVar12 = xmlPushInput(ctxt,input);
                      if (-1 < iVar12) {
                        if ((ctxt->progressive == 0) &&
                           ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                          xmlGROW(ctxt);
                        }
                        uVar11 = xmlCurrentChar(ctxt,(int *)&local_70);
                        pxVar6 = ctxt->input;
                        if (pxVar6 == input) {
                          pxVar25 = pxVar6->cur;
                          bVar30 = true;
                          bVar29 = pxVar6->end <= pxVar25;
                          if (!bVar29) {
                            iVar12 = 0;
                            do {
                              if ((int)uVar11 < 0x100) {
                                if ((0xd < uVar11) || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0)) {
                                  bVar28 = 0x1f < (int)uVar11;
                                  goto LAB_0015b01b;
                                }
                              }
                              else {
                                bVar28 = (uVar11 - 0x10000 < 0x100000 || uVar11 - 0xe000 < 0x1ffe)
                                         || (int)uVar11 < 0xd800;
LAB_0015b01b:
                                if (!bVar28) break;
                              }
                              xmlBufferAdd(buf,pxVar25,(int)local_70);
                              if (100 < iVar12) {
                                if ((ctxt->progressive == 0) &&
                                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                  xmlGROW(ctxt);
                                }
                                iVar12 = 0;
                                if (ctxt->instate != XML_PARSER_EOF) goto LAB_0015b07c;
LAB_0015b3d5:
                                xmlBufferFree(buf);
                                goto LAB_0015abdd;
                              }
                              iVar12 = iVar12 + 1;
LAB_0015b07c:
                              pxVar6 = ctxt->input;
                              if (*pxVar6->cur == '\n') {
                                pxVar6->line = pxVar6->line + 1;
                                pxVar6->col = 1;
                              }
                              else {
                                pxVar6->col = pxVar6->col + 1;
                              }
                              pxVar6->cur = pxVar6->cur + (int)local_70;
                              uVar11 = xmlCurrentChar(ctxt,(int *)&local_70);
                              if (uVar11 == 0) {
                                if ((ctxt->progressive == 0) &&
                                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                                  xmlGROW(ctxt);
                                }
                                if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b3d5;
                                uVar11 = xmlCurrentChar(ctxt,(int *)&local_70);
                                iVar12 = 0;
                              }
                              pxVar6 = ctxt->input;
                              bVar30 = pxVar6 == input;
                              if (!bVar30) goto LAB_0015a978;
                              pxVar25 = pxVar6->cur;
                              bVar28 = pxVar25 < pxVar6->end;
                              bVar29 = !bVar28;
                            } while (bVar28);
                          }
                          if ((!bVar30) || (!bVar29)) goto LAB_0015a978;
                          xmlPopInput(ctxt);
                        }
                        else {
LAB_0015a978:
                          if ((int)uVar11 < 0x100) {
                            if (((int)uVar11 < 0x20) &&
                               ((0xd < uVar11 || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0)))) {
LAB_0015adc7:
                              xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                                "xmlLoadEntityContent: invalid char value %d\n",
                                                uVar11);
                              xmlBufferFree(buf);
                              goto LAB_0015abdd;
                            }
                          }
                          else if ((0xfffff < uVar11 - 0x10000 && 0x1ffd < uVar11 - 0xe000) &&
                                   0xd7ff < (int)uVar11) goto LAB_0015adc7;
                        }
                        pxVar17->content = buf->content;
                        buf->content = (xmlChar *)0x0;
                        xmlBufferFree(buf);
                        goto LAB_0015abdd;
                      }
                    }
                    xmlBufferFree(buf);
                  }
                }
                else {
                  xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
                }
              }
LAB_0015abdd:
              ctxt->depth = ctxt->depth + 1;
              pxVar25 = (xmlChar *)0x0;
              pxVar18 = xmlStringDecodeEntities(ctxt,pxVar17->content,local_4c,'\0','\0','\0');
              ctxt->depth = ctxt->depth + -1;
              if (pxVar18 != (xmlChar *)0x0) {
                xVar1 = *pxVar18;
                pxVar19 = pxVar18;
                sVar23 = local_68;
                uVar26 = local_60;
                while (xVar1 != '\0') {
                  pxVar18 = pxVar18 + 1;
                  pxVar13[sVar23] = xVar1;
                  local_58 = pxVar19;
                  if (uVar26 < sVar23 + 0x65) {
                    iVar12 = xmlParserEntityCheck(ctxt,sVar23 + 1,pxVar17,0);
                    pxVar19 = local_58;
                    if (iVar12 != 0) goto LAB_0015b402;
                    uVar21 = uVar26 * 2 + 100;
                    if (uVar21 < uVar26) {
                      bVar29 = false;
                    }
                    else {
                      pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar13,uVar21);
                      bVar29 = pxVar19 != (xmlChar *)0x0;
                      if (bVar29) {
                        uVar26 = uVar21;
                        pxVar13 = pxVar19;
                      }
                    }
                    if (!bVar29) goto LAB_0015b3f3;
                  }
                  pxVar19 = local_58;
                  sVar23 = sVar23 + 1;
                  xVar1 = *pxVar18;
                }
                goto LAB_0015acd8;
              }
LAB_0015b47f:
              pxVar19 = (xmlChar *)0x0;
              goto LAB_0015b402;
            }
          }
LAB_0015af13:
          uVar11 = 0;
          if (str < local_38) {
            uVar11 = xmlStringCurrentChar(ctxt,str,&local_48);
          }
          if ((((uVar11 == local_3c) || (uVar11 == local_40)) || (uVar11 == 0)) ||
             (uVar11 == local_44)) break;
        }
      }
      pxVar13[sVar23] = '\0';
      return pxVar13;
    }
    local_58 = (xmlChar *)0x0;
    pxVar13 = (xmlChar *)0x0;
LAB_0015b3f3:
    xmlErrMemory(ctxt,(char *)0x0);
    pxVar19 = local_58;
LAB_0015b402:
    if (pxVar19 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar19);
    }
    if (pxVar13 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar13);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
		      int what, xmlChar end, xmlChar  end2, xmlChar end3) {
    xmlChar *buffer = NULL;
    size_t buffer_size = 0;
    size_t nbchars = 0;

    xmlChar *current = NULL;
    xmlChar *rep = NULL;
    const xmlChar *last;
    xmlEntityPtr ent;
    int c,l;

    if ((ctxt == NULL) || (str == NULL) || (len < 0))
	return(NULL);
    last = str + len;

    if (((ctxt->depth > 40) &&
         ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
	(ctxt->depth > 1024)) {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buffer_size = XML_PARSER_BIG_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     * we are operating on already parsed values.
     */
    if (str < last)
	c = CUR_SCHAR(str, l);
    else
        c = 0;
    while ((c != 0) && (c != end) && /* non input consuming loop */
           (c != end2) && (c != end3) &&
           (ctxt->instate != XML_PARSER_EOF)) {

	if (c == 0) break;
        if ((c == '&') && (str[1] == '#')) {
	    int val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0)
                goto int_error;
	    COPY_BUF(0,buffer,nbchars,val);
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	} else if ((c == '&') && (what & XML_SUBSTITUTE_REF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding Entity Reference: %.30s\n",
			str);
	    ent = xmlParseStringEntityRef(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content != NULL) {
		    COPY_BUF(0,buffer,nbchars,ent->content[0]);
		    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
			growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
		    }
		} else {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    goto int_error;
		}
	    } else if ((ent != NULL) && (ent->content != NULL)) {
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;

                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    } else if (ent != NULL) {
		int i = xmlStrlen(ent->name);
		const xmlChar *cur = ent->name;

		buffer[nbchars++] = '&';
		if (nbchars + i + XML_PARSER_BUFFER_SIZE > buffer_size) {
		    growBuffer(buffer, i + XML_PARSER_BUFFER_SIZE);
		}
		for (;i > 0;i--)
		    buffer[nbchars++] = *cur++;
		buffer[nbchars++] = ';';
	    }
	} else if (c == '%' && (what & XML_SUBSTITUTE_PEREF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding PE Reference: %.30s\n", str);
	    ent = xmlParseStringPEReference(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if (ent != NULL) {
                if (ent->content == NULL) {
		    /*
		     * Note: external parsed entities will not be loaded,
		     * it is not required for a non-validating parser to
		     * complete external PEReferences coming from the
		     * internal subset
		     */
		    if (((ctxt->options & XML_PARSE_NOENT) != 0) ||
			((ctxt->options & XML_PARSE_DTDVALID) != 0) ||
			(ctxt->validate != 0)) {
			xmlLoadEntityContent(ctxt, ent);
		    } else {
			xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
		  "not validating will not read content for PE entity %s\n",
		                      ent->name, NULL);
		    }
		}
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;
                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    }
	} else {
	    COPY_BUF(l,buffer,nbchars,c);
	    str += l;
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	}
	if (str < last)
	    c = CUR_SCHAR(str, l);
	else
	    c = 0;
    }
    buffer[nbchars] = 0;
    return(buffer);

mem_error:
    xmlErrMemory(ctxt, NULL);
int_error:
    if (rep != NULL)
        xmlFree(rep);
    if (buffer != NULL)
        xmlFree(buffer);
    return(NULL);
}